

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O1

BigUnsigned<4> *
absl::lts_20250127::strings_internal::BigUnsigned<4>::FiveToTheNth
          (BigUnsigned<4> *__return_storage_ptr__,int n)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  int __n2;
  
  uVar2 = (ulong)(uint)n;
  BigUnsigned(__return_storage_ptr__,1);
  if (0x1a < n) {
    bVar3 = true;
    do {
      iVar1 = (int)(uVar2 * 0x2f684bdb >> 0x20);
      uVar4 = ((uint)((int)uVar2 - iVar1) >> 1) + iVar1 >> 4;
      if (0x13 < uVar4) {
        uVar4 = 0x14;
      }
      if (bVar3) {
        memcpy(__return_storage_ptr__->words_,
               strings_internal::(anonymous_namespace)::kLargePowersOfFive +
               (long)(int)((uVar4 - 1) * uVar4) * 4,(ulong)(uVar4 * 8));
        __return_storage_ptr__->size_ = uVar4 * 2;
        bVar3 = false;
      }
      else {
        MultiplyBy(__return_storage_ptr__,uVar4 * 2,
                   (uint32_t *)
                   (strings_internal::(anonymous_namespace)::kLargePowersOfFive +
                   (long)(int)((uVar4 - 1) * uVar4) * 4));
      }
      n = (int)uVar2 + uVar4 * -0x1b;
      uVar2 = (ulong)(uint)n;
    } while (0x1a < n);
  }
  MultiplyByFiveToTheNth(__return_storage_ptr__,n);
  return __return_storage_ptr__;
}

Assistant:

BigUnsigned<max_words> BigUnsigned<max_words>::FiveToTheNth(
    int n) {
  BigUnsigned answer(1u);

  // Seed from the table of large powers, if possible.
  bool first_pass = true;
  while (n >= kLargePowerOfFiveStep) {
    int big_power =
        std::min(n / kLargePowerOfFiveStep, kLargestPowerOfFiveIndex);
    if (first_pass) {
      // just copy, rather than multiplying by 1
      std::copy_n(LargePowerOfFiveData(big_power),
                  LargePowerOfFiveSize(big_power), answer.words_);
      answer.size_ = LargePowerOfFiveSize(big_power);
      first_pass = false;
    } else {
      answer.MultiplyBy(LargePowerOfFiveSize(big_power),
                        LargePowerOfFiveData(big_power));
    }
    n -= kLargePowerOfFiveStep * big_power;
  }
  answer.MultiplyByFiveToTheNth(n);
  return answer;
}